

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::ExtendTransitions(TimeZoneInfo *this)

{
  pointer *ppTVar1;
  byte bVar2;
  pointer pTVar3;
  pointer pTVar4;
  int_least64_t iVar5;
  int_least64_t iVar6;
  int_least8_t iVar7;
  int_least8_t iVar8;
  int_least8_t iVar9;
  int_least8_t iVar10;
  int_least8_t iVar11;
  undefined3 uVar12;
  int_least8_t iVar13;
  int_least8_t iVar14;
  int_least8_t iVar15;
  int_least8_t iVar16;
  int_least8_t iVar17;
  undefined3 uVar18;
  uint_least8_t uVar19;
  undefined7 uVar20;
  TimeZoneInfo *pTVar21;
  bool bVar22;
  weekday wVar23;
  long lVar24;
  diff_t dVar25;
  int_fast64_t iVar26;
  int_fast64_t iVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  Transition *__args;
  iterator __position;
  Transition *__args_00;
  int jan1_weekday;
  bool bVar31;
  uint_least8_t dst_ti;
  uint_least8_t std_ti;
  PosixTimeZone posix;
  civil_second jan1;
  uint_fast8_t local_142;
  byte local_141;
  vector<absl::lts_20250127::time_internal::cctz::Transition,std::allocator<absl::lts_20250127::time_internal::cctz::Transition>>
  *local_140;
  TimeZoneInfo *local_138;
  int_fast64_t local_130;
  long local_128;
  Transition local_120;
  PosixTimeZone local_f0;
  Transition local_70;
  civil_second local_40;
  
  this->extended_ = false;
  if ((this->future_spec_)._M_string_length == 0) {
    return true;
  }
  local_f0.std_abbr._M_dataplus._M_p = (pointer)&local_f0.std_abbr.field_2;
  local_f0.std_abbr._M_string_length = 0;
  local_f0.std_abbr.field_2._M_local_buf[0] = '\0';
  local_f0.dst_abbr._M_dataplus._M_p = (pointer)&local_f0.dst_abbr.field_2;
  local_f0.dst_abbr._M_string_length = 0;
  local_f0.dst_abbr.field_2._M_local_buf[0] = '\0';
  bVar22 = ParsePosixSpec(&this->future_spec_,&local_f0);
  if ((bVar22) &&
     (bVar22 = GetTransitionType(this,local_f0.std_offset,false,&local_f0.std_abbr,&local_141),
     bVar22)) {
    if (local_f0.dst_abbr._M_string_length == 0) {
      bVar2 = (this->transitions_).
              super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].type_index;
      bVar22 = true;
      if (bVar2 == local_141) goto LAB_00269943;
      pTVar3 = (this->transition_types_).
               super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar28 = (ulong)((uint)bVar2 * 0x30);
      uVar29 = (ulong)((uint)local_141 * 0x30);
      if (*(int *)((long)&pTVar3->utc_offset + uVar28) ==
          *(int *)((long)&pTVar3->utc_offset + uVar29)) {
        if ((&pTVar3->is_dst)[uVar28] == (&pTVar3->is_dst)[uVar29]) {
          bVar22 = (&pTVar3->abbr_index)[uVar28] == (&pTVar3->abbr_index)[uVar29];
          goto LAB_00269943;
        }
      }
    }
    else {
      bVar22 = GetTransitionType(this,local_f0.dst_offset,true,&local_f0.dst_abbr,&local_142);
      if (bVar22) {
        if ((((local_f0.dst_start.date.fmt == N) &&
             (local_f0.dst_start.date.field_1 == (anon_union_8_3_4e90bb4b_for_Date_1)0x0)) &&
            (local_f0.dst_start.time.offset == 0)) &&
           (((local_f0.dst_end.date.fmt == J &&
             (local_f0.dst_end.date.field_1 == (anon_union_8_3_4e90bb4b_for_Date_1)0x16d)) &&
            ((local_f0.std_offset - local_f0.dst_offset) + local_f0.dst_end.time.offset == 0x15180))
           )) {
          bVar22 = EquivTransitions(this,(this->transitions_).
                                         super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                                         ._M_impl.super__Vector_impl_data._M_finish[-1].type_index,
                                    local_142);
        }
        else {
          local_140 = (vector<absl::lts_20250127::time_internal::cctz::Transition,std::allocator<absl::lts_20250127::time_internal::cctz::Transition>>
                       *)&this->transitions_;
          std::
          vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
          ::reserve((vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                     *)local_140,
                    ((long)(this->transitions_).
                           super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->transitions_).
                           super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
                    0x324);
          this->extended_ = true;
          pTVar4 = (this->transitions_).
                   super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_130 = pTVar4[-1].unix_time;
          LocalTime((absolute_lookup *)&local_120,this,local_130,
                    (TransitionType *)
                    ((long)&((this->transition_types_).
                             super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                             ._M_impl.super__Vector_impl_data._M_start)->utc_offset +
                    (ulong)((uint)pTVar4[-1].type_index * 0x30)));
          this->last_year_ = local_120.unix_time;
          bVar22 = false;
          if ((local_120.unix_time & 3U) == 0) {
            lVar24 = local_120.unix_time * -0x70a3d70a3d70a3d7;
            bVar22 = true;
            if ((lVar24 + 0x51eb851eb851eb8U >> 2 | lVar24 << 0x3e) < 0x28f5c28f5c28f5d) {
              bVar22 = (lVar24 + 0x51eb851eb851eb0U >> 4 | lVar24 << 0x3c) < 0xa3d70a3d70a3d7;
            }
          }
          local_40.f_.y = local_120.unix_time;
          local_40.f_.m = '\x01';
          local_40.f_.d = '\x01';
          local_40.f_.hh = '\0';
          local_40.f_.mm = '\0';
          local_40.f_._12_4_ = local_40.f_._12_4_ & 0xffffff00;
          local_138 = this;
          dVar25 = detail::difference((detail *)local_120.unix_time,
                                      CONCAT44(local_40.f_._12_4_,0x101),0x7b2,0x101);
          lVar24 = dVar25 * 0x3c;
          wVar23 = detail::get_weekday(&local_40);
          jan1_weekday = wVar23 + tuesday;
          if (saturday < wVar23) {
            jan1_weekday = 0;
          }
          local_120.unix_time = 0;
          local_120.type_index = local_142;
          local_120.civil_sec.f_.y = 0x7b2;
          local_120.civil_sec.f_.m = '\x01';
          local_120.civil_sec.f_.d = '\x01';
          local_120.civil_sec.f_.hh = '\0';
          local_120.civil_sec.f_.mm = '\0';
          local_120.civil_sec.f_.ss = '\0';
          local_120.prev_civil_sec.f_.y = 0x7b2;
          local_120.prev_civil_sec.f_.m = '\x01';
          local_120.prev_civil_sec.f_.d = '\x01';
          local_120.prev_civil_sec.f_.hh = '\0';
          local_120.prev_civil_sec.f_.mm = '\0';
          local_120.prev_civil_sec.f_.ss = '\0';
          local_70.type_index = local_141;
          local_70.civil_sec.f_.y = 0x7b2;
          local_70.civil_sec.f_.m = '\x01';
          local_70.civil_sec.f_.d = '\x01';
          local_70.civil_sec.f_.hh = '\0';
          local_70.civil_sec.f_.mm = '\0';
          local_70.civil_sec.f_.ss = '\0';
          local_70.prev_civil_sec.f_.y = 0x7b2;
          local_70.prev_civil_sec.f_.m = '\x01';
          local_70.prev_civil_sec.f_.d = '\x01';
          local_70.prev_civil_sec.f_.hh = '\0';
          local_70.prev_civil_sec.f_.mm = '\0';
          local_70.prev_civil_sec.f_.ss = '\0';
          local_128 = local_138->last_year_ + 0x191;
          while( true ) {
            iVar26 = anon_unknown_0::TransOffset(bVar22,jan1_weekday,&local_f0.dst_start);
            iVar27 = anon_unknown_0::TransOffset(bVar22,jan1_weekday,&local_f0.dst_end);
            pTVar21 = local_138;
            local_120.unix_time = (iVar26 + lVar24) - local_f0.std_offset;
            local_70.unix_time = (iVar27 + lVar24) - local_f0.dst_offset;
            __args = &local_120;
            __args_00 = &local_70;
            if (local_70.unix_time <= local_120.unix_time) {
              __args = &local_70;
              __args_00 = &local_120;
            }
            if (local_130 < __args_00->unix_time) {
              __position._M_current =
                   (local_138->transitions_).
                   super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (local_130 < __args->unix_time) {
                if (__position._M_current ==
                    (local_138->transitions_).
                    super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<absl::lts_20250127::time_internal::cctz::Transition,std::allocator<absl::lts_20250127::time_internal::cctz::Transition>>
                  ::_M_realloc_insert<absl::lts_20250127::time_internal::cctz::Transition_const&>
                            (local_140,__position,__args);
                  __position._M_current =
                       (pTVar21->transitions_).
                       super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                }
                else {
                  iVar5 = __args->unix_time;
                  uVar19 = __args->type_index;
                  uVar20 = *(undefined7 *)&__args->field_0x9;
                  iVar6 = (__args->civil_sec).f_.y;
                  iVar13 = (__args->civil_sec).f_.m;
                  iVar14 = (__args->civil_sec).f_.d;
                  iVar15 = (__args->civil_sec).f_.hh;
                  iVar16 = (__args->civil_sec).f_.mm;
                  iVar17 = (__args->civil_sec).f_.ss;
                  uVar18 = *(undefined3 *)&(__args->civil_sec).f_.field_0xd;
                  iVar7 = (__args->prev_civil_sec).f_.m;
                  iVar8 = (__args->prev_civil_sec).f_.d;
                  iVar9 = (__args->prev_civil_sec).f_.hh;
                  iVar10 = (__args->prev_civil_sec).f_.mm;
                  iVar11 = (__args->prev_civil_sec).f_.ss;
                  uVar12 = *(undefined3 *)&(__args->prev_civil_sec).f_.field_0xd;
                  ((__position._M_current)->prev_civil_sec).f_.y = (__args->prev_civil_sec).f_.y;
                  ((__position._M_current)->prev_civil_sec).f_.m = iVar7;
                  ((__position._M_current)->prev_civil_sec).f_.d = iVar8;
                  ((__position._M_current)->prev_civil_sec).f_.hh = iVar9;
                  ((__position._M_current)->prev_civil_sec).f_.mm = iVar10;
                  ((__position._M_current)->prev_civil_sec).f_.ss = iVar11;
                  *(undefined3 *)&((__position._M_current)->prev_civil_sec).f_.field_0xd = uVar12;
                  ((__position._M_current)->civil_sec).f_.y = iVar6;
                  ((__position._M_current)->civil_sec).f_.m = iVar13;
                  ((__position._M_current)->civil_sec).f_.d = iVar14;
                  ((__position._M_current)->civil_sec).f_.hh = iVar15;
                  ((__position._M_current)->civil_sec).f_.mm = iVar16;
                  ((__position._M_current)->civil_sec).f_.ss = iVar17;
                  *(undefined3 *)&((__position._M_current)->civil_sec).f_.field_0xd = uVar18;
                  (__position._M_current)->unix_time = iVar5;
                  (__position._M_current)->type_index = uVar19;
                  *(undefined7 *)&(__position._M_current)->field_0x9 = uVar20;
                  __position._M_current =
                       (local_138->transitions_).
                       super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                  (local_138->transitions_).
                  super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                  ._M_impl.super__Vector_impl_data._M_finish = __position._M_current;
                }
              }
              if (__position._M_current ==
                  (pTVar21->transitions_).
                  super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<absl::lts_20250127::time_internal::cctz::Transition,std::allocator<absl::lts_20250127::time_internal::cctz::Transition>>
                ::_M_realloc_insert<absl::lts_20250127::time_internal::cctz::Transition_const&>
                          (local_140,__position,__args_00);
              }
              else {
                iVar5 = __args_00->unix_time;
                uVar19 = __args_00->type_index;
                uVar20 = *(undefined7 *)&__args_00->field_0x9;
                iVar6 = (__args_00->civil_sec).f_.y;
                iVar13 = (__args_00->civil_sec).f_.m;
                iVar14 = (__args_00->civil_sec).f_.d;
                iVar15 = (__args_00->civil_sec).f_.hh;
                iVar16 = (__args_00->civil_sec).f_.mm;
                iVar17 = (__args_00->civil_sec).f_.ss;
                uVar18 = *(undefined3 *)&(__args_00->civil_sec).f_.field_0xd;
                iVar7 = (__args_00->prev_civil_sec).f_.m;
                iVar8 = (__args_00->prev_civil_sec).f_.d;
                iVar9 = (__args_00->prev_civil_sec).f_.hh;
                iVar10 = (__args_00->prev_civil_sec).f_.mm;
                iVar11 = (__args_00->prev_civil_sec).f_.ss;
                uVar12 = *(undefined3 *)&(__args_00->prev_civil_sec).f_.field_0xd;
                ((__position._M_current)->prev_civil_sec).f_.y = (__args_00->prev_civil_sec).f_.y;
                ((__position._M_current)->prev_civil_sec).f_.m = iVar7;
                ((__position._M_current)->prev_civil_sec).f_.d = iVar8;
                ((__position._M_current)->prev_civil_sec).f_.hh = iVar9;
                ((__position._M_current)->prev_civil_sec).f_.mm = iVar10;
                ((__position._M_current)->prev_civil_sec).f_.ss = iVar11;
                *(undefined3 *)&((__position._M_current)->prev_civil_sec).f_.field_0xd = uVar12;
                ((__position._M_current)->civil_sec).f_.y = iVar6;
                ((__position._M_current)->civil_sec).f_.m = iVar13;
                ((__position._M_current)->civil_sec).f_.d = iVar14;
                ((__position._M_current)->civil_sec).f_.hh = iVar15;
                ((__position._M_current)->civil_sec).f_.mm = iVar16;
                ((__position._M_current)->civil_sec).f_.ss = iVar17;
                *(undefined3 *)&((__position._M_current)->civil_sec).f_.field_0xd = uVar18;
                (__position._M_current)->unix_time = iVar5;
                (__position._M_current)->type_index = uVar19;
                *(undefined7 *)&(__position._M_current)->field_0x9 = uVar20;
                ppTVar1 = &(pTVar21->transitions_).
                           super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppTVar1 = *ppTVar1 + 1;
              }
            }
            if (pTVar21->last_year_ == local_128) break;
            uVar28 = pTVar21->last_year_ + 1;
            if (bVar22 == false && (uVar28 & 3) == 0) {
              lVar30 = uVar28 * -0x70a3d70a3d70a3d7;
              bVar31 = true;
              if ((lVar30 + 0x51eb851eb851eb8U >> 2 | lVar30 << 0x3e) < 0x28f5c28f5c28f5d) {
                bVar31 = (lVar30 + 0x51eb851eb851eb0U >> 4 | lVar30 << 0x3c) < 0xa3d70a3d70a3d7;
              }
            }
            else {
              bVar31 = false;
            }
            lVar24 = lVar24 + *(int *)((long)&(anonymous_namespace)::kSecsPerYear +
                                      (ulong)bVar22 * 4);
            jan1_weekday = (jan1_weekday +
                           *(int *)((long)&(anonymous_namespace)::kDaysPerYear + (ulong)bVar22 * 4))
                           % 7;
            pTVar21->last_year_ = uVar28;
            bVar22 = bVar31;
          }
          bVar22 = true;
        }
        goto LAB_00269943;
      }
    }
  }
  bVar22 = false;
LAB_00269943:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.dst_abbr._M_dataplus._M_p != &local_f0.dst_abbr.field_2) {
    operator_delete(local_f0.dst_abbr._M_dataplus._M_p,
                    CONCAT71(local_f0.dst_abbr.field_2._M_allocated_capacity._1_7_,
                             local_f0.dst_abbr.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.std_abbr._M_dataplus._M_p != &local_f0.std_abbr.field_2) {
    operator_delete(local_f0.std_abbr._M_dataplus._M_p,
                    CONCAT71(local_f0.std_abbr.field_2._M_allocated_capacity._1_7_,
                             local_f0.std_abbr.field_2._M_local_buf[0]) + 1);
  }
  return bVar22;
}

Assistant:

bool TimeZoneInfo::ExtendTransitions() {
  extended_ = false;
  if (future_spec_.empty()) return true;  // last transition prevails

  PosixTimeZone posix;
  if (!ParsePosixSpec(future_spec_, &posix)) return false;

  // Find transition type for the future std specification.
  std::uint_least8_t std_ti;
  if (!GetTransitionType(posix.std_offset, false, posix.std_abbr, &std_ti))
    return false;

  if (posix.dst_abbr.empty()) {  // std only
    // The future specification should match the last transition, and
    // that means that handling the future will fall out naturally.
    return EquivTransitions(transitions_.back().type_index, std_ti);
  }

  // Find transition type for the future dst specification.
  std::uint_least8_t dst_ti;
  if (!GetTransitionType(posix.dst_offset, true, posix.dst_abbr, &dst_ti))
    return false;

  if (AllYearDST(posix)) {  // dst only
    // The future specification should match the last transition, and
    // that means that handling the future will fall out naturally.
    return EquivTransitions(transitions_.back().type_index, dst_ti);
  }

  // Extend the transitions for an additional 401 years using the future
  // specification. Years beyond those can be handled by mapping back to
  // a cycle-equivalent year within that range. Note that we need 401
  // (well, at least the first transition in the 401st year) so that the
  // end of the 400th year is mapped back to an extended year. And first
  // we may also need two additional transitions for the current year.
  transitions_.reserve(transitions_.size() + 2 + 401 * 2);
  extended_ = true;

  const Transition& last(transitions_.back());
  const std::int_fast64_t last_time = last.unix_time;
  const TransitionType& last_tt(transition_types_[last.type_index]);
  last_year_ = LocalTime(last_time, last_tt).cs.year();
  bool leap_year = IsLeap(last_year_);
  const civil_second jan1(last_year_);
  std::int_fast64_t jan1_time = jan1 - civil_second();
  int jan1_weekday = ToPosixWeekday(get_weekday(jan1));

  Transition dst = {0, dst_ti, civil_second(), civil_second()};
  Transition std = {0, std_ti, civil_second(), civil_second()};
  for (const year_t limit = last_year_ + 401;; ++last_year_) {
    auto dst_trans_off = TransOffset(leap_year, jan1_weekday, posix.dst_start);
    auto std_trans_off = TransOffset(leap_year, jan1_weekday, posix.dst_end);
    dst.unix_time = jan1_time + dst_trans_off - posix.std_offset;
    std.unix_time = jan1_time + std_trans_off - posix.dst_offset;
    const auto* ta = dst.unix_time < std.unix_time ? &dst : &std;
    const auto* tb = dst.unix_time < std.unix_time ? &std : &dst;
    if (last_time < tb->unix_time) {
      if (last_time < ta->unix_time) transitions_.push_back(*ta);
      transitions_.push_back(*tb);
    }
    if (last_year_ == limit) break;
    jan1_time += kSecsPerYear[leap_year];
    jan1_weekday = (jan1_weekday + kDaysPerYear[leap_year]) % 7;
    leap_year = !leap_year && IsLeap(last_year_ + 1);
  }

  return true;
}